

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DFsScript::DFsScript(DFsScript *this)

{
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00869090;
  memset(this->sections,0,0x88);
  this->variables[0].field_0.p = (DFsVariable *)0x0;
  this->variables[1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[3].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[4].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[5].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[6].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[7].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[8].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[9].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[10].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[0xb].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[0xc].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[0xd].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[0xe].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  this->variables[0xf].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
  memset(this->children,0,0x808);
  this->data = (char *)0x0;
  this->scriptnum = -1;
  this->len = 0;
  (this->parent).field_0.p = (DFsScript *)0x0;
  (this->trigger).field_0.p = (AActor *)0x0;
  this->lastiftrue = false;
  return;
}

Assistant:

DFsScript::DFsScript()
{
	int i;
	
	for(i=0; i<SECTIONSLOTS; i++) sections[i] = NULL;
	for(i=0; i<VARIABLESLOTS; i++) variables[i] = NULL;
	for(i=0; i<MAXSCRIPTS; i++)	children[i] = NULL;

	data = NULL;
	scriptnum = -1;
	len = 0;
	parent = NULL;
	trigger = NULL;
	lastiftrue = false;
}